

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initJavaData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  QMultiHash<char,_QLatin1String> local_cb8;
  QMultiHash<char,_QLatin1String> local_ca8;
  QLatin1String local_c98;
  char local_c81;
  QLatin1String local_c80;
  char local_c69;
  pair<char,_QLatin1String> local_c68;
  pair<char,_QLatin1String> pStack_c50;
  iterator local_c38;
  undefined8 local_c30;
  QMultiHash<char,_QLatin1String> local_c28;
  QLatin1String local_c18;
  char local_c01;
  QLatin1String local_c00;
  char local_be9;
  QLatin1String local_be8;
  char local_bd1;
  QLatin1String local_bd0;
  char local_bb9;
  QLatin1String local_bb8;
  char local_ba1;
  QLatin1String local_ba0;
  char local_b89;
  QLatin1String local_b88;
  char local_b71;
  QLatin1String local_b70;
  char local_b59;
  QLatin1String local_b58;
  char local_b41;
  QLatin1String local_b40;
  char local_b29;
  pair<char,_QLatin1String> local_b28;
  pair<char,_QLatin1String> pStack_b10;
  pair<char,_QLatin1String> pStack_af8;
  pair<char,_QLatin1String> pStack_ae0;
  pair<char,_QLatin1String> pStack_ac8;
  pair<char,_QLatin1String> pStack_ab0;
  pair<char,_QLatin1String> pStack_a98;
  pair<char,_QLatin1String> pStack_a80;
  pair<char,_QLatin1String> pStack_a68;
  pair<char,_QLatin1String> pStack_a50;
  iterator local_a38;
  undefined8 local_a30;
  QMultiHash<char,_QLatin1String> local_a28;
  QLatin1String local_a18;
  char local_a01;
  QLatin1String local_a00;
  char local_9e9;
  QLatin1String local_9e8;
  char local_9d1;
  QLatin1String local_9d0;
  char local_9b9;
  QLatin1String local_9b8;
  char local_9a1;
  QLatin1String local_9a0;
  char local_989;
  QLatin1String local_988;
  char local_971;
  QLatin1String local_970;
  char local_959;
  QLatin1String local_958;
  char local_941;
  QLatin1String local_940;
  char local_929;
  QLatin1String local_928;
  char local_911;
  QLatin1String local_910;
  char local_8f9;
  QLatin1String local_8f8;
  char local_8e1;
  QLatin1String local_8e0;
  char local_8c9;
  QLatin1String local_8c8;
  char local_8b1;
  QLatin1String local_8b0;
  char local_899;
  QLatin1String local_898;
  char local_881;
  QLatin1String local_880;
  char local_869;
  QLatin1String local_868;
  char local_851;
  QLatin1String local_850;
  char local_839;
  QLatin1String local_838;
  char local_821;
  QLatin1String local_820;
  char local_809;
  QLatin1String local_808;
  char local_7f1;
  QLatin1String local_7f0;
  char local_7d9;
  QLatin1String local_7d8;
  char local_7c1;
  QLatin1String local_7c0;
  char local_7a9;
  QLatin1String local_7a8;
  char local_791;
  QLatin1String local_790;
  char local_779;
  QLatin1String local_778;
  char local_761;
  QLatin1String local_760;
  char local_749;
  QLatin1String local_748;
  char local_731;
  QLatin1String local_730;
  char local_719;
  QLatin1String local_718;
  char local_701;
  QLatin1String local_700;
  char local_6e9;
  QLatin1String local_6e8;
  char local_6d1;
  QLatin1String local_6d0;
  char local_6b9;
  QLatin1String local_6b8;
  char local_6a1;
  QLatin1String local_6a0;
  char local_689;
  QLatin1String local_688;
  char local_671;
  QLatin1String local_670;
  char local_659;
  QLatin1String local_658;
  char local_641;
  QLatin1String local_640;
  char local_629;
  QLatin1String local_628;
  char local_611;
  QLatin1String local_610;
  char local_5f9;
  QLatin1String local_5f8;
  char local_5e1;
  QLatin1String local_5e0;
  char local_5c9;
  QLatin1String local_5c8;
  char local_5b1;
  QLatin1String local_5b0;
  char local_599;
  QLatin1String local_598;
  char local_581;
  QLatin1String local_580;
  char local_569;
  QLatin1String local_568;
  char local_551;
  QLatin1String local_550;
  char local_539;
  QLatin1String local_538;
  char local_521;
  pair<char,_QLatin1String> local_520;
  pair<char,_QLatin1String> pStack_508;
  pair<char,_QLatin1String> pStack_4f0;
  pair<char,_QLatin1String> pStack_4d8;
  pair<char,_QLatin1String> pStack_4c0;
  pair<char,_QLatin1String> pStack_4a8;
  pair<char,_QLatin1String> pStack_490;
  pair<char,_QLatin1String> pStack_478;
  pair<char,_QLatin1String> pStack_460;
  pair<char,_QLatin1String> pStack_448;
  pair<char,_QLatin1String> pStack_430;
  pair<char,_QLatin1String> pStack_418;
  pair<char,_QLatin1String> pStack_400;
  pair<char,_QLatin1String> pStack_3e8;
  pair<char,_QLatin1String> pStack_3d0;
  pair<char,_QLatin1String> pStack_3b8;
  pair<char,_QLatin1String> pStack_3a0;
  pair<char,_QLatin1String> pStack_388;
  pair<char,_QLatin1String> pStack_370;
  pair<char,_QLatin1String> pStack_358;
  pair<char,_QLatin1String> pStack_340;
  pair<char,_QLatin1String> pStack_328;
  pair<char,_QLatin1String> pStack_310;
  pair<char,_QLatin1String> pStack_2f8;
  pair<char,_QLatin1String> pStack_2e0;
  pair<char,_QLatin1String> pStack_2c8;
  pair<char,_QLatin1String> pStack_2b0;
  pair<char,_QLatin1String> pStack_298;
  pair<char,_QLatin1String> pStack_280;
  pair<char,_QLatin1String> pStack_268;
  pair<char,_QLatin1String> pStack_250;
  pair<char,_QLatin1String> pStack_238;
  pair<char,_QLatin1String> pStack_220;
  pair<char,_QLatin1String> pStack_208;
  pair<char,_QLatin1String> pStack_1f0;
  pair<char,_QLatin1String> pStack_1d8;
  pair<char,_QLatin1String> pStack_1c0;
  pair<char,_QLatin1String> pStack_1a8;
  pair<char,_QLatin1String> pStack_190;
  pair<char,_QLatin1String> pStack_178;
  pair<char,_QLatin1String> pStack_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_521 = 'a';
  QLatin1String::QLatin1String(&local_538,"abstract");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_520,&local_521,&local_538);
  local_539 = 'a';
  QLatin1String::QLatin1String(&local_550,"assert");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_508,&local_539,&local_550)
  ;
  local_551 = 'b';
  QLatin1String::QLatin1String(&local_568,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4f0,&local_551,&local_568)
  ;
  local_569 = 'c';
  QLatin1String::QLatin1String(&local_580,"case");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4d8,&local_569,&local_580)
  ;
  local_581 = 'c';
  QLatin1String::QLatin1String(&local_598,"catch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4c0,&local_581,&local_598)
  ;
  local_599 = 'c';
  QLatin1String::QLatin1String(&local_5b0,"const");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4a8,&local_599,&local_5b0)
  ;
  local_5b1 = 'c';
  QLatin1String::QLatin1String(&local_5c8,"continue");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_490,&local_5b1,&local_5c8)
  ;
  local_5c9 = 'd';
  QLatin1String::QLatin1String(&local_5e0,"default");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_478,&local_5c9,&local_5e0)
  ;
  local_5e1 = 'd';
  QLatin1String::QLatin1String(&local_5f8,"do");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_460,&local_5e1,&local_5f8)
  ;
  local_5f9 = 'e';
  QLatin1String::QLatin1String(&local_610,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_448,&local_5f9,&local_610)
  ;
  local_611 = 'e';
  QLatin1String::QLatin1String(&local_628,"exports");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_430,&local_611,&local_628)
  ;
  local_629 = 'e';
  QLatin1String::QLatin1String(&local_640,"extends");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_418,&local_629,&local_640)
  ;
  local_641 = 'f';
  QLatin1String::QLatin1String(&local_658,"final");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_400,&local_641,&local_658)
  ;
  local_659 = 'f';
  QLatin1String::QLatin1String(&local_670,"finally");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3e8,&local_659,&local_670)
  ;
  local_671 = 'f';
  QLatin1String::QLatin1String(&local_688,"for");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3d0,&local_671,&local_688)
  ;
  local_689 = 'g';
  QLatin1String::QLatin1String(&local_6a0,"goto");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3b8,&local_689,&local_6a0)
  ;
  local_6a1 = 'i';
  QLatin1String::QLatin1String(&local_6b8,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3a0,&local_6a1,&local_6b8)
  ;
  local_6b9 = 'i';
  QLatin1String::QLatin1String(&local_6d0,"implements");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_388,&local_6b9,&local_6d0)
  ;
  local_6d1 = 'i';
  QLatin1String::QLatin1String(&local_6e8,"import");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_370,&local_6d1,&local_6e8)
  ;
  local_6e9 = 'i';
  QLatin1String::QLatin1String(&local_700,"instanceof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_358,&local_6e9,&local_700)
  ;
  local_701 = 'i';
  QLatin1String::QLatin1String(&local_718,"interface");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_340,&local_701,&local_718)
  ;
  local_719 = 'l';
  QLatin1String::QLatin1String(&local_730,"long");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_328,&local_719,&local_730)
  ;
  local_731 = 'm';
  QLatin1String::QLatin1String(&local_748,"module");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_310,&local_731,&local_748)
  ;
  local_749 = 'n';
  QLatin1String::QLatin1String(&local_760,"native");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2f8,&local_749,&local_760)
  ;
  local_761 = 'n';
  QLatin1String::QLatin1String(&local_778,"new");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2e0,&local_761,&local_778)
  ;
  local_779 = 'n';
  QLatin1String::QLatin1String(&local_790,"null");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2c8,&local_779,&local_790)
  ;
  local_791 = 'o';
  QLatin1String::QLatin1String(&local_7a8,"open");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2b0,&local_791,&local_7a8)
  ;
  local_7a9 = 'o';
  QLatin1String::QLatin1String(&local_7c0,"opens");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_298,&local_7a9,&local_7c0)
  ;
  local_7c1 = 'p';
  QLatin1String::QLatin1String(&local_7d8,"package");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_280,&local_7c1,&local_7d8)
  ;
  local_7d9 = 'p';
  QLatin1String::QLatin1String(&local_7f0,"private");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_268,&local_7d9,&local_7f0)
  ;
  local_7f1 = 'p';
  QLatin1String::QLatin1String(&local_808,"protected");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_250,&local_7f1,&local_808)
  ;
  local_809 = 'p';
  QLatin1String::QLatin1String(&local_820,"provides");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_238,&local_809,&local_820)
  ;
  local_821 = 'p';
  QLatin1String::QLatin1String(&local_838,"public");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_220,&local_821,&local_838)
  ;
  local_839 = 'r';
  QLatin1String::QLatin1String(&local_850,"requires");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_208,&local_839,&local_850)
  ;
  local_851 = 'r';
  QLatin1String::QLatin1String(&local_868,"return");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1f0,&local_851,&local_868)
  ;
  local_869 = 's';
  QLatin1String::QLatin1String(&local_880,"static");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1d8,&local_869,&local_880)
  ;
  local_881 = 's';
  QLatin1String::QLatin1String(&local_898,"strictfp");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1c0,&local_881,&local_898)
  ;
  local_899 = 's';
  QLatin1String::QLatin1String(&local_8b0,"super");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1a8,&local_899,&local_8b0)
  ;
  local_8b1 = 's';
  QLatin1String::QLatin1String(&local_8c8,"switch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_190,&local_8b1,&local_8c8)
  ;
  local_8c9 = 's';
  QLatin1String::QLatin1String(&local_8e0,"synchronized");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_178,&local_8c9,&local_8e0)
  ;
  local_8e1 = 't';
  QLatin1String::QLatin1String(&local_8f8,"this");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_160,&local_8e1,&local_8f8)
  ;
  local_8f9 = 't';
  QLatin1String::QLatin1String(&local_910,"throw");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_148,&local_8f9,&local_910)
  ;
  local_911 = 't';
  QLatin1String::QLatin1String(&local_928,"throws");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_130,&local_911,&local_928)
  ;
  local_929 = 't';
  QLatin1String::QLatin1String(&local_940,"to");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_118,&local_929,&local_940)
  ;
  local_941 = 't';
  QLatin1String::QLatin1String(&local_958,"transient");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_100,&local_941,&local_958)
  ;
  local_959 = 't';
  QLatin1String::QLatin1String(&local_970,"transitive");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e8,&local_959,&local_970);
  local_971 = 't';
  QLatin1String::QLatin1String(&local_988,"try");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_d0,&local_971,&local_988);
  local_989 = 'u';
  QLatin1String::QLatin1String(&local_9a0,"uses");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b8,&local_989,&local_9a0);
  local_9a1 = 'v';
  QLatin1String::QLatin1String(&local_9b8,"var");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a0,&local_9a1,&local_9b8);
  local_9b9 = 'v';
  QLatin1String::QLatin1String(&local_9d0,"volatile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_88,&local_9b9,&local_9d0);
  local_9d1 = 'w';
  QLatin1String::QLatin1String(&local_9e8,"while");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_70,&local_9d1,&local_9e8);
  local_9e9 = 'w';
  QLatin1String::QLatin1String(&local_a00,"with");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_58,&local_9e9,&local_a00);
  local_a01 = 'y';
  QLatin1String::QLatin1String(&local_a18,"yield");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_40,&local_a01,&local_a18);
  local_28 = &local_520;
  local_20 = 0x35;
  list_01._M_len = 0x35;
  list_01._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&java_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  local_b29 = 'v';
  QLatin1String::QLatin1String(&local_b40,"void");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_b28,&local_b29,&local_b40);
  local_b41 = 'f';
  QLatin1String::QLatin1String(&local_b58,"float");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b10,&local_b41,&local_b58)
  ;
  local_b59 = 'b';
  QLatin1String::QLatin1String(&local_b70,"boolean");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_af8,&local_b59,&local_b70)
  ;
  local_b71 = 'b';
  QLatin1String::QLatin1String(&local_b88,"byte");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ae0,&local_b71,&local_b88)
  ;
  local_b89 = 'i';
  QLatin1String::QLatin1String(&local_ba0,"int");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ac8,&local_b89,&local_ba0)
  ;
  local_ba1 = 'c';
  QLatin1String::QLatin1String(&local_bb8,"char");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ab0,&local_ba1,&local_bb8)
  ;
  local_bb9 = 'c';
  QLatin1String::QLatin1String(&local_bd0,"class");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a98,&local_bb9,&local_bd0)
  ;
  local_bd1 = 'd';
  QLatin1String::QLatin1String(&local_be8,"double");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a80,&local_bd1,&local_be8)
  ;
  local_be9 = 'e';
  QLatin1String::QLatin1String(&local_c00,"enum");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a68,&local_be9,&local_c00)
  ;
  local_c01 = 's';
  QLatin1String::QLatin1String(&local_c18,"short");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a50,&local_c01,&local_c18)
  ;
  local_a38 = &local_b28;
  local_a30 = 10;
  list_00._M_len = 10;
  list_00._M_array = local_a38;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_a28,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&java_types,&local_a28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_a28);
  local_c69 = 'f';
  QLatin1String::QLatin1String(&local_c80,"false");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_c68,&local_c69,&local_c80);
  local_c81 = 't';
  QLatin1String::QLatin1String(&local_c98,"true");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_c50,&local_c81,&local_c98)
  ;
  local_c38 = &local_c68;
  local_c30 = 2;
  list._M_len = 2;
  list._M_array = local_c38;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_c28,list);
  QMultiHash<char,_QLatin1String>::operator=(&java_literals,&local_c28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_c28);
  memset(&local_ca8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_ca8);
  QMultiHash<char,_QLatin1String>::operator=(&java_builtin,&local_ca8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_ca8);
  memset(&local_cb8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_cb8);
  QMultiHash<char,_QLatin1String>::operator=(&java_other,&local_cb8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_cb8);
  return;
}

Assistant:

void initJavaData() {
    java_keywords = {{('a'), QLatin1String("abstract")},
                     {('a'), QLatin1String("assert")},
                     {('b'), QLatin1String("break")},
                     {('c'), QLatin1String("case")},
                     {('c'), QLatin1String("catch")},
                     {('c'), QLatin1String("const")},
                     {('c'), QLatin1String("continue")},
                     {('d'), QLatin1String("default")},
                     {('d'), QLatin1String("do")},
                     {('e'), QLatin1String("else")},
                     {('e'), QLatin1String("exports")},
                     {('e'), QLatin1String("extends")},
                     {('f'), QLatin1String("final")},
                     {('f'), QLatin1String("finally")},
                     {('f'), QLatin1String("for")},
                     {('g'), QLatin1String("goto")},
                     {('i'), QLatin1String("if")},
                     {('i'), QLatin1String("implements")},
                     {('i'), QLatin1String("import")},
                     {('i'), QLatin1String("instanceof")},
                     {('i'), QLatin1String("interface")},
                     {('l'), QLatin1String("long")},
                     {('m'), QLatin1String("module")},
                     {('n'), QLatin1String("native")},
                     {('n'), QLatin1String("new")},
                     {('n'), QLatin1String("null")},
                     {('o'), QLatin1String("open")},
                     {('o'), QLatin1String("opens")},
                     {('p'), QLatin1String("package")},
                     {('p'), QLatin1String("private")},
                     {('p'), QLatin1String("protected")},
                     {('p'), QLatin1String("provides")},
                     {('p'), QLatin1String("public")},
                     {('r'), QLatin1String("requires")},
                     {('r'), QLatin1String("return")},
                     {('s'), QLatin1String("static")},
                     {('s'), QLatin1String("strictfp")},
                     {('s'), QLatin1String("super")},
                     {('s'), QLatin1String("switch")},
                     {('s'), QLatin1String("synchronized")},
                     {('t'), QLatin1String("this")},
                     {('t'), QLatin1String("throw")},
                     {('t'), QLatin1String("throws")},
                     {('t'), QLatin1String("to")},
                     {('t'), QLatin1String("transient")},
                     {('t'), QLatin1String("transitive")},
                     {('t'), QLatin1String("try")},
                     {('u'), QLatin1String("uses")},
                     {('v'), QLatin1String("var")},
                     {('v'), QLatin1String("volatile")},
                     {('w'), QLatin1String("while")},
                     {('w'), QLatin1String("with")},
                     {('y'), QLatin1String("yield")}};

    java_types = {
        {('v'), QLatin1String("void")},    {('f'), QLatin1String("float")},
        {('b'), QLatin1String("boolean")}, {('b'), QLatin1String("byte")},
        {('i'), QLatin1String("int")},     {('c'), QLatin1String("char")},
        {('c'), QLatin1String("class")},   {('d'), QLatin1String("double")},
        {('e'), QLatin1String("enum")},    {('s'), QLatin1String("short")},

    };

    java_literals = {{('f'), QLatin1String("false")},
                     {('t'), QLatin1String("true")}};

    java_builtin = {

    };

    java_other = {

    };
}